

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void display_bolt(game_event_type type,game_event_data *data,void *user)

{
  _Bool _Var1;
  wchar_t ny;
  wchar_t nx;
  wchar_t v;
  uint8_t a;
  wchar_t c;
  uint8_t local_39;
  wchar_t local_38;
  wchar_t local_34;
  
  v = (wchar_t)(player->opts).delay_factor;
  if ((data->bolt).seen == true) {
    local_34 = (data->point).x;
    _Var1 = (data->bolt).beam;
    ny = (data->birthstage).n_choices;
    nx = (data->birthstage).initial_choice;
    bolt_pict((data->message).type,(data->bolt).ox,ny,nx,local_34,&local_39,&local_38);
    print_rel(local_38,local_39,ny,nx);
    move_cursor_relative(ny,nx);
    Term_fresh();
    if (player->upkeep->redraw != 0) {
      redraw_stuff(player);
    }
    Term_xtra(L'\r',v);
    event_signal_point(EVENT_MAP,nx,ny);
    Term_fresh();
    if (player->upkeep->redraw != 0) {
      redraw_stuff(player);
    }
    if (_Var1 != false) {
      bolt_pict(ny,nx,ny,nx,local_34,&local_39,&local_38);
      print_rel(local_38,local_39,ny,nx);
    }
  }
  else if ((data->bolt).drawing == true) {
    Term_xtra(L'\r',v);
    return;
  }
  return;
}

Assistant:

static void display_bolt(game_event_type type, game_event_data *data,
						 void *user)
{
	int msec = player->opts.delay_factor;
	int proj_type = data->bolt.proj_type;
	bool drawing = data->bolt.drawing;
	bool seen = data->bolt.seen;
	bool beam = data->bolt.beam;
	int oy = data->bolt.oy;
	int ox = data->bolt.ox;
	int y = data->bolt.y;
	int x = data->bolt.x;

	/* Only do visuals if the player can "see" the bolt */
	if (seen) {
		uint8_t a;
		wchar_t c;

		/* Obtain the bolt pict */
		bolt_pict(oy, ox, y, x, proj_type, &a, &c);

		/* Visual effects */
		print_rel(c, a, y, x);
		move_cursor_relative(y, x);
		Term_fresh();
		if (player->upkeep->redraw)
			redraw_stuff(player);
		Term_xtra(TERM_XTRA_DELAY, msec);
		event_signal_point(EVENT_MAP, x, y);
		Term_fresh();
		if (player->upkeep->redraw)
			redraw_stuff(player);

		/* Display "beam" grids */
		if (beam) {

			/* Obtain the explosion pict */
			bolt_pict(y, x, y, x, proj_type, &a, &c);

			/* Visual effects */
			print_rel(c, a, y, x);
		}
	} else if (drawing) {
		/* Delay for consistency */
		Term_xtra(TERM_XTRA_DELAY, msec);
	}
}